

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

void ptls_aead_xor_iv(ptls_aead_context_t *ctx,void *_bytes,size_t len)

{
  size_t sVar1;
  uint8_t iv [32];
  byte local_38 [32];
  
  (*ctx->do_get_iv)(ctx,local_38);
  if (len != 0) {
    sVar1 = 0;
    do {
      local_38[sVar1] = local_38[sVar1] ^ *(byte *)((long)_bytes + sVar1);
      sVar1 = sVar1 + 1;
    } while (len != sVar1);
  }
  (*ctx->do_set_iv)(ctx,local_38);
  return;
}

Assistant:

void ptls_aead_xor_iv(ptls_aead_context_t *ctx, const void *_bytes, size_t len)
{
    const uint8_t *bytes = _bytes;
    uint8_t iv[PTLS_MAX_IV_SIZE];

    ptls_aead_get_iv(ctx, iv);
    for (size_t i = 0; i < len; ++i)
        iv[i] ^= bytes[i];
    ptls_aead_set_iv(ctx, iv);
}